

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O3

void __thiscall test_matrix_sparse_at_Test::TestBody(test_matrix_sparse_at_Test *this)

{
  initializer_list<double> value;
  initializer_list<double> value_00;
  AssertHelper AVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  double *pdVar5;
  char *pcVar6;
  long lVar7;
  StringLike<const_char_*> *regex;
  StringLike<const_char_*> *regex_00;
  StringLike<const_char_*> *regex_01;
  StringLike<const_char_*> *regex_02;
  StringLike<const_char_*> *regex_03;
  StringLike<const_char_*> *regex_04;
  AssertHelper AVar8;
  initializer_list<unsigned_long> non_zero;
  initializer_list<unsigned_long> non_zero_00;
  initializer_list<unsigned_long> index;
  initializer_list<unsigned_long> index_00;
  DeathTest *gtest_dt;
  Matrix_Sparse matrix_const;
  DeathTest *gtest_dt_3;
  Matrix_Sparse matrix_non_const;
  undefined1 local_228 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_220;
  undefined1 *local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  AssertHelper local_1e8;
  undefined8 uStack_1e0;
  undefined1 *local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined1 local_1a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1a0;
  pointer local_198;
  pointer puStack_190;
  pointer local_188;
  pointer puStack_180;
  pointer local_178;
  AssertHelper local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  AssertHelper *local_130;
  undefined8 uStack_128;
  iterator local_120;
  undefined8 uStack_118;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_110;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_f8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_e0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_c8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_b0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_98;
  Matrix_Sparse local_80;
  
  local_1d8 = (undefined1 *)0x5;
  uStack_1d0 = 5;
  local_1e8.data_ = (AssertHelperData *)0x0;
  uStack_1e0 = 2;
  local_1c8 = 7;
  local_188 = (pointer)0x3;
  puStack_180 = (pointer)&DAT_00000004;
  local_198 = (pointer)0x2;
  puStack_190 = (pointer)0x0;
  local_1a8 = (undefined1  [8])0x1;
  _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
  local_178 = (pointer)0x3;
  local_120 = (iterator)local_228;
  local_208 = 0x4014000000000000;
  uStack_200 = 0x4018000000000000;
  local_218 = &DAT_4008000000000000;
  uStack_210 = 0x4010000000000000;
  local_228 = (undefined1  [8])0x3ff0000000000000;
  _Stack_220._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4000000000000000;
  local_1f8 = 0x401c000000000000;
  uStack_118 = 7;
  value._M_len = 7;
  value._M_array = local_120;
  non_zero._M_len = 5;
  non_zero._M_array = (iterator)&local_1e8;
  index._M_len = 7;
  index._M_array = (iterator)local_1a8;
  Disa::Matrix_Sparse::Matrix_Sparse(&local_80,non_zero,index,value,5);
  local_228 = (undefined1  [8])0x3;
  local_1e8.data_ = (AssertHelperData *)&DAT_00000004;
  pdVar5 = Disa::Matrix_Sparse::at(&local_80,(size_t *)local_228,(size_t *)&local_1e8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1a8,"matrix_non_const.at(3, 4)","6.0",*pdVar5,6.0);
  if (local_1a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_228);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((_Alloc_hider *)&(_Stack_1a0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x51,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1e8,(Message *)local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    if (local_228 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_228 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_1a0._M_pi);
  }
  local_1a8 = (undefined1  [8])0x3;
  local_228 = (undefined1  [8])0x4;
  pdVar5 = Disa::Matrix_Sparse::at(&local_80,(size_t *)local_1a8,(size_t *)local_228);
  *pdVar5 = -10.0;
  local_228 = (undefined1  [8])0x3;
  local_1e8.data_ = (AssertHelperData *)&DAT_00000004;
  pdVar5 = Disa::Matrix_Sparse::at(&local_80,(size_t *)local_228,(size_t *)&local_1e8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1a8,"matrix_non_const.at(3, 4)","-10.0",*pdVar5,-10.0);
  if (local_1a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_228);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((_Alloc_hider *)&(_Stack_1a0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x53,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1e8,(Message *)local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    if (local_228 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_228 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_1a0._M_pi);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_228 = (undefined1  [8])0x168590;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_1a8,
               (testing *)local_228,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_98,(PolymorphicMatcher *)local_1a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1a0._M_pi);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("double x = matrix_non_const.at(10, 4)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_98,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x54,(DeathTest **)&local_1e8);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_98);
    AVar8.data_ = local_1e8.data_;
    if (!bVar2) goto LAB_0011120b;
    if (local_1e8.data_ != (AssertHelperData *)0x0) {
      iVar4 = (**(code **)(*(long *)local_1e8.data_ + 0x10))(local_1e8.data_);
      AVar1.data_ = local_1e8.data_;
      if (iVar4 == 0) {
        iVar4 = (**(code **)(*(long *)local_1e8.data_ + 0x18))(local_1e8.data_);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
        cVar3 = (**(code **)(*(long *)AVar1.data_ + 0x20))(AVar1.data_,bVar2);
        if (cVar3 == '\0') {
          (**(code **)(*(long *)AVar8.data_ + 8))(AVar8.data_);
          goto LAB_0011120b;
        }
      }
      else if (iVar4 == 1) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          local_1a8 = (undefined1  [8])&DAT_0000000a;
          local_228 = (undefined1  [8])0x4;
          Disa::Matrix_Sparse::at(&local_80,(size_t *)local_1a8,(size_t *)local_228);
        }
        (**(code **)(*(long *)local_1e8.data_ + 0x28))(local_1e8.data_,2);
        (**(code **)(*(long *)AVar1.data_ + 0x28))(AVar1.data_,0);
      }
      lVar7 = *(long *)AVar8.data_;
      goto LAB_00111267;
    }
  }
  else {
LAB_0011120b:
    testing::Message::Message((Message *)local_1a8);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x54,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
    if (local_1a8 != (undefined1  [8])0x0) {
      lVar7 = *(long *)local_1a8;
      AVar8.data_ = (AssertHelperData *)local_1a8;
LAB_00111267:
      (**(code **)(lVar7 + 8))(AVar8.data_);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_228 = (undefined1  [8])0x168590;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_1a8,
               (testing *)local_228,regex_00);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_b0,(PolymorphicMatcher *)local_1a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1a0._M_pi);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("double x = matrix_non_const.at(0, 6)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_b0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x55,(DeathTest **)&local_1e8);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_b0);
    AVar8.data_ = local_1e8.data_;
    if (!bVar2) goto LAB_001113a0;
    if (local_1e8.data_ != (AssertHelperData *)0x0) {
      iVar4 = (**(code **)(*(long *)local_1e8.data_ + 0x10))(local_1e8.data_);
      AVar1.data_ = local_1e8.data_;
      if (iVar4 == 0) {
        iVar4 = (**(code **)(*(long *)local_1e8.data_ + 0x18))(local_1e8.data_);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
        cVar3 = (**(code **)(*(long *)AVar1.data_ + 0x20))(AVar1.data_,bVar2);
        if (cVar3 == '\0') {
          (**(code **)(*(long *)AVar8.data_ + 8))(AVar8.data_);
          goto LAB_001113a0;
        }
      }
      else if (iVar4 == 1) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          local_1a8 = (undefined1  [8])0x0;
          local_228 = (undefined1  [8])0x6;
          Disa::Matrix_Sparse::at(&local_80,(size_t *)local_1a8,(size_t *)local_228);
        }
        (**(code **)(*(long *)local_1e8.data_ + 0x28))(local_1e8.data_,2);
        (**(code **)(*(long *)AVar1.data_ + 0x28))(AVar1.data_,0);
      }
      lVar7 = *(long *)AVar8.data_;
      goto LAB_001113fc;
    }
  }
  else {
LAB_001113a0:
    testing::Message::Message((Message *)local_1a8);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x55,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
    if (local_1a8 != (undefined1  [8])0x0) {
      lVar7 = *(long *)local_1a8;
      AVar8.data_ = (AssertHelperData *)local_1a8;
LAB_001113fc:
      (**(code **)(lVar7 + 8))(AVar8.data_);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_228 = (undefined1  [8])0x168590;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_1a8,
               (testing *)local_228,regex_01);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_c8,(PolymorphicMatcher *)local_1a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1a0._M_pi);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("double x = matrix_non_const.at(10, 2)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_c8,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x56,(DeathTest **)&local_1e8);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_c8);
    AVar8.data_ = local_1e8.data_;
    if (!bVar2) goto LAB_00111535;
    if (local_1e8.data_ != (AssertHelperData *)0x0) {
      iVar4 = (**(code **)(*(long *)local_1e8.data_ + 0x10))(local_1e8.data_);
      AVar1.data_ = local_1e8.data_;
      if (iVar4 == 0) {
        iVar4 = (**(code **)(*(long *)local_1e8.data_ + 0x18))(local_1e8.data_);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
        cVar3 = (**(code **)(*(long *)AVar1.data_ + 0x20))(AVar1.data_,bVar2);
        if (cVar3 == '\0') {
          (**(code **)(*(long *)AVar8.data_ + 8))(AVar8.data_);
          goto LAB_00111535;
        }
      }
      else if (iVar4 == 1) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          local_1a8 = (undefined1  [8])&DAT_0000000a;
          local_228 = (undefined1  [8])0x2;
          Disa::Matrix_Sparse::at(&local_80,(size_t *)local_1a8,(size_t *)local_228);
        }
        (**(code **)(*(long *)local_1e8.data_ + 0x28))(local_1e8.data_,2);
        (**(code **)(*(long *)AVar1.data_ + 0x28))(AVar1.data_,0);
      }
      lVar7 = *(long *)AVar8.data_;
      goto LAB_00111591;
    }
  }
  else {
LAB_00111535:
    testing::Message::Message((Message *)local_1a8);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x56,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_228,(Message *)local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228);
    if (local_1a8 != (undefined1  [8])0x0) {
      lVar7 = *(long *)local_1a8;
      AVar8.data_ = (AssertHelperData *)local_1a8;
LAB_00111591:
      (**(code **)(lVar7 + 8))(AVar8.data_);
    }
  }
  local_148 = 5;
  uStack_140 = 5;
  local_158.data_ = (AssertHelperData *)0x0;
  uStack_150 = 2;
  local_138 = 7;
  local_208 = 3;
  uStack_200 = 4;
  local_218 = (undefined1 *)0x2;
  uStack_210 = 0;
  local_228 = (undefined1  [8])0x1;
  _Stack_220._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
  local_1f8 = 3;
  local_1c8 = 0x4014000000000000;
  uStack_1c0 = 0x4018000000000000;
  local_1d8 = &DAT_4008000000000000;
  uStack_1d0 = 0x4010000000000000;
  local_1e8.data_ = (AssertHelperData *)0x3ff0000000000000;
  uStack_1e0 = 0x4000000000000000;
  local_1b8 = 0x401c000000000000;
  uStack_128 = 7;
  value_00._M_len = 7;
  value_00._M_array = (iterator)&local_1e8;
  non_zero_00._M_len = 5;
  non_zero_00._M_array = (iterator)&local_158;
  index_00._M_len = 7;
  index_00._M_array = (iterator)local_228;
  local_130 = &local_1e8;
  Disa::Matrix_Sparse::Matrix_Sparse((Matrix_Sparse *)local_1a8,non_zero_00,index_00,value_00,5);
  local_1e8.data_ = (AssertHelperData *)0x3;
  local_158.data_ = (AssertHelperData *)&DAT_00000004;
  pdVar5 = Disa::Matrix_Sparse::at
                     ((Matrix_Sparse *)local_1a8,(size_t *)&local_1e8,(size_t *)&local_158);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_228,"matrix_const.at(3, 4)","6.0",*pdVar5,6.0);
  if (local_228[0] == (testing)0x0) {
    testing::Message::Message((Message *)&local_1e8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_220._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((_Alloc_hider *)&(_Stack_220._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x59,pcVar6);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    if (local_1e8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_1e8.data_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_220._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_220,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_220._M_pi);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_1e8.data_ = (AssertHelperData *)0x168590;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_228,
               (testing *)&local_1e8,regex_02);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_e0,(PolymorphicMatcher *)local_228);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_220._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_220._M_pi);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("double x = matrix_const.at(10, 4)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_e0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x5a,(DeathTest **)&local_158);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_e0);
    AVar8.data_ = local_158.data_;
    if (!bVar2) goto LAB_00111859;
    if (local_158.data_ != (AssertHelperData *)0x0) {
      iVar4 = (**(code **)(*(long *)local_158.data_ + 0x10))(local_158.data_);
      AVar1.data_ = local_158.data_;
      if (iVar4 == 0) {
        iVar4 = (**(code **)(*(long *)local_158.data_ + 0x18))(local_158.data_);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
        cVar3 = (**(code **)(*(long *)AVar1.data_ + 0x20))(AVar1.data_,bVar2);
        if (cVar3 == '\0') {
          (**(code **)(*(long *)AVar8.data_ + 8))(AVar8.data_);
          goto LAB_00111859;
        }
      }
      else if (iVar4 == 1) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          local_228 = (undefined1  [8])&DAT_0000000a;
          local_1e8.data_ = (AssertHelperData *)&DAT_00000004;
          Disa::Matrix_Sparse::at
                    ((Matrix_Sparse *)local_1a8,(size_t *)local_228,(size_t *)&local_1e8);
        }
        (**(code **)(*(long *)local_158.data_ + 0x28))(local_158.data_,2);
        (**(code **)(*(long *)AVar1.data_ + 0x28))(AVar1.data_,0);
      }
      lVar7 = *(long *)AVar8.data_;
      goto LAB_001118ac;
    }
  }
  else {
LAB_00111859:
    testing::Message::Message((Message *)local_228);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x5a,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1e8,(Message *)local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    if (local_228 != (undefined1  [8])0x0) {
      lVar7 = *(long *)local_228;
      AVar8.data_ = (AssertHelperData *)local_228;
LAB_001118ac:
      (**(code **)(lVar7 + 8))(AVar8.data_);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_1e8.data_ = (AssertHelperData *)0x168590;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_228,
               (testing *)&local_1e8,regex_03);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_f8,(PolymorphicMatcher *)local_228);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_220._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_220._M_pi);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("double x = matrix_const.at(0, 6)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_f8,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x5b,(DeathTest **)&local_158);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_f8);
    AVar8.data_ = local_158.data_;
    if (!bVar2) goto LAB_001119e7;
    if (local_158.data_ != (AssertHelperData *)0x0) {
      iVar4 = (**(code **)(*(long *)local_158.data_ + 0x10))(local_158.data_);
      AVar1.data_ = local_158.data_;
      if (iVar4 == 0) {
        iVar4 = (**(code **)(*(long *)local_158.data_ + 0x18))(local_158.data_);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
        cVar3 = (**(code **)(*(long *)AVar1.data_ + 0x20))(AVar1.data_,bVar2);
        if (cVar3 == '\0') {
          (**(code **)(*(long *)AVar8.data_ + 8))(AVar8.data_);
          goto LAB_001119e7;
        }
      }
      else if (iVar4 == 1) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          local_228 = (undefined1  [8])0x0;
          local_1e8.data_ = (AssertHelperData *)&DAT_00000006;
          Disa::Matrix_Sparse::at
                    ((Matrix_Sparse *)local_1a8,(size_t *)local_228,(size_t *)&local_1e8);
        }
        (**(code **)(*(long *)local_158.data_ + 0x28))(local_158.data_,2);
        (**(code **)(*(long *)AVar1.data_ + 0x28))(AVar1.data_,0);
      }
      lVar7 = *(long *)AVar8.data_;
      goto LAB_00111a3a;
    }
  }
  else {
LAB_001119e7:
    testing::Message::Message((Message *)local_228);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x5b,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1e8,(Message *)local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    if (local_228 != (undefined1  [8])0x0) {
      lVar7 = *(long *)local_228;
      AVar8.data_ = (AssertHelperData *)local_228;
LAB_00111a3a:
      (**(code **)(lVar7 + 8))(AVar8.data_);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_1e8.data_ = (AssertHelperData *)0x168590;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_228,
               (testing *)&local_1e8,regex_04);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_110,(PolymorphicMatcher *)local_228);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_220._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_220._M_pi);
    }
    bVar2 = testing::internal::DeathTest::Create
                      ("double x = matrix_const.at(10, 2)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_110,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x5c,(DeathTest **)&local_158);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_110);
    AVar8.data_ = local_158.data_;
    if (!bVar2) goto LAB_00111b75;
    if (local_158.data_ == (AssertHelperData *)0x0) goto LAB_00111bcb;
    iVar4 = (**(code **)(*(long *)local_158.data_ + 0x10))(local_158.data_);
    AVar1.data_ = local_158.data_;
    if (iVar4 == 0) {
      iVar4 = (**(code **)(*(long *)local_158.data_ + 0x18))(local_158.data_);
      bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
      cVar3 = (**(code **)(*(long *)AVar1.data_ + 0x20))(AVar1.data_,bVar2);
      if (cVar3 == '\0') {
        (**(code **)(*(long *)AVar8.data_ + 8))(AVar8.data_);
        goto LAB_00111b75;
      }
    }
    else if (iVar4 == 1) {
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        local_228 = (undefined1  [8])&DAT_0000000a;
        local_1e8.data_ = (AssertHelperData *)0x2;
        Disa::Matrix_Sparse::at((Matrix_Sparse *)local_1a8,(size_t *)local_228,(size_t *)&local_1e8)
        ;
      }
      (**(code **)(*(long *)local_158.data_ + 0x28))(local_158.data_,2);
      (**(code **)(*(long *)AVar1.data_ + 0x28))(AVar1.data_,0);
    }
    lVar7 = *(long *)AVar8.data_;
  }
  else {
LAB_00111b75:
    testing::Message::Message((Message *)local_228);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x5c,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1e8,(Message *)local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    if (local_228 == (undefined1  [8])0x0) goto LAB_00111bcb;
    lVar7 = *(long *)local_228;
    AVar8.data_ = (AssertHelperData *)local_228;
  }
  (**(code **)(lVar7 + 8))(AVar8.data_);
LAB_00111bcb:
  Disa::Matrix_Sparse::~Matrix_Sparse((Matrix_Sparse *)local_1a8);
  Disa::Matrix_Sparse::~Matrix_Sparse(&local_80);
  return;
}

Assistant:

TEST(test_matrix_sparse, at) {
  Matrix_Sparse matrix_non_const({0, 2, 5, 5, 7}, {1, 3, 2, 0, 3, 4, 3}, {1.0, 2.0, 3.0, 4.0, 5.0, 6.0, 7.0}, 5);
  EXPECT_DOUBLE_EQ(matrix_non_const.at(3, 4), 6.0);
  matrix_non_const.at(3, 4) = -10.0;
  EXPECT_DOUBLE_EQ(matrix_non_const.at(3, 4), -10.0);
  EXPECT_DEATH(double x = matrix_non_const.at(10, 4), "./*");
  EXPECT_DEATH(double x = matrix_non_const.at(0, 6), "./*");
  EXPECT_DEATH(double x = matrix_non_const.at(10, 2), "./*");

  const Matrix_Sparse matrix_const({0, 2, 5, 5, 7}, {1, 3, 2, 0, 3, 4, 3}, {1.0, 2.0, 3.0, 4.0, 5.0, 6.0, 7.0}, 5);
  EXPECT_DOUBLE_EQ(matrix_const.at(3, 4), 6.0);
  EXPECT_DEATH(double x = matrix_const.at(10, 4), "./*");
  EXPECT_DEATH(double x = matrix_const.at(0, 6), "./*");
  EXPECT_DEATH(double x = matrix_const.at(10, 2), "./*");
}